

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::readValue(Reader *this)

{
  Location pCVar1;
  size_t len;
  ValueHolder VVar2;
  Value *pVVar3;
  Location pCVar4;
  bool bVar5;
  ValueHolder *pVVar6;
  _Elt_pointer ppVVar7;
  ushort uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Token token;
  ValueHolder local_50;
  ushort local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined8 local_30;
  Token local_28;
  
  if (999 < stackDepth_g) {
    local_50.string_ = (char *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Exceeded stackLimit in readValue().","");
    throwRuntimeError((string *)&local_50);
  }
  stackDepth_g = stackDepth_g + 1;
  skipCommentTokens(this,&local_28);
  if ((this->collectComments_ == true) && (len = (this->commentsBefore_)._M_string_length, len != 0)
     ) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setComment(ppVVar7[-1],(this->commentsBefore_)._M_dataplus._M_p,len,commentBefore);
    std::__cxx11::string::_M_replace
              ((ulong)&this->commentsBefore_,0,(char *)(this->commentsBefore_)._M_string_length,
               0x120b2a);
  }
  switch(local_28.type_) {
  case tokenObjectBegin:
    bVar5 = readObject(this,&local_28);
    break;
  case tokenObjectEnd:
  case tokenArrayEnd:
  case tokenArraySeparator:
    if ((this->features_).allowDroppedNullPlaceholders_ != true) goto switchD_0010b6ec_default;
    this->current_ = this->current_ + -1;
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                )0x0;
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar6 = &ppVVar7[-1]->value_;
    local_48 = *(ushort *)(pVVar6 + 1);
    local_50 = *pVVar6;
    *(ushort *)(pVVar6 + 1) = local_48 & 0xfe00;
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar7 = ppVVar7 + -1;
    }
    pVVar3 = *ppVVar7;
    pCVar1 = this->begin_;
    pCVar4 = this->current_;
    pVVar3->start_ = (ptrdiff_t)(pCVar4 + ~(ulong)pCVar1);
    pVVar3->limit_ = (long)pCVar4 - (long)pCVar1;
    goto LAB_0010b992;
  case tokenArrayBegin:
    bVar5 = readArray(this,&local_28);
    break;
  case tokenString:
    bVar5 = decodeString(this,&local_28);
    goto LAB_0010b99e;
  case tokenNumber:
    bVar5 = decodeNumber(this,&local_28);
    goto LAB_0010b99e;
  case tokenTrue:
    local_50.bool_ = true;
    goto LAB_0010b862;
  case tokenFalse:
    local_50.uint_ = (ulong)(uint7)local_50.uint_._1_7_ << 8;
LAB_0010b862:
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar6 = &ppVVar7[-1]->value_;
    local_48 = *(ushort *)(pVVar6 + 1);
    VVar2.uint_ = *(LargestUInt *)pVVar6;
    pVVar6->uint_ = (LargestUInt)local_50;
    uVar8 = local_48 & 0xfe00 | 5;
    local_50.uint_ = VVar2.uint_;
LAB_0010b89c:
    local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                )ZEXT816(0);
    *(ushort *)(pVVar6 + 1) = uVar8;
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar7 = ppVVar7 + -1;
    }
    pVVar3 = *ppVVar7;
    pCVar1 = this->begin_;
    auVar9._8_4_ = (int)pCVar1;
    auVar9._0_8_ = pCVar1;
    auVar9._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    pVVar3->start_ = (long)local_28.start_ - (long)pCVar1;
    pVVar3->limit_ = (long)local_28.end_ - auVar9._8_8_;
LAB_0010b992:
    local_48 = local_48 & 0x1ff;
    local_30 = 0;
    Value::~Value((Value *)&local_50);
    bVar5 = true;
    goto LAB_0010b99e;
  case tokenNull:
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar6 = &ppVVar7[-1]->value_;
    local_48 = *(ushort *)(pVVar6 + 1);
    uVar8 = local_48 & 0xfe00;
    local_50 = *pVVar6;
    goto LAB_0010b89c;
  default:
switchD_0010b6ec_default:
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ppVVar7 = ppVVar7 + -1;
    }
    pVVar3 = *ppVVar7;
    pCVar1 = this->begin_;
    auVar10._8_4_ = (int)pCVar1;
    auVar10._0_8_ = pCVar1;
    auVar10._12_4_ = (int)((ulong)pCVar1 >> 0x20);
    pVVar3->start_ = (long)local_28.start_ - (long)pCVar1;
    pVVar3->limit_ = (long)local_28.end_ - auVar10._8_8_;
    local_50.string_ = (char *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Syntax error: value, object or array expected.","");
    addError(this,(string *)&local_50,&local_28,(Location)0x0);
    if (local_50 != &local_40) {
      operator_delete(local_50.string_);
    }
    return false;
  }
  ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar7 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar7[-1]->limit_ = (long)this->current_ - (long)this->begin_;
LAB_0010b99e:
  if (this->collectComments_ == true) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    this->lastValueEnd_ = this->current_;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->lastValue_ = ppVVar7[-1];
  }
  stackDepth_g = stackDepth_g + -1;
  return bVar5;
}

Assistant:

bool Reader::readValue() {
  // This is a non-reentrant way to support a stackLimit. Terrible!
  // But this deprecated class has a security problem: Bad input can
  // cause a seg-fault. This seems like a fair, binary-compatible way
  // to prevent the problem.
  if (stackDepth_g >= stackLimit_g) throwRuntimeError("Exceeded stackLimit in readValue().");
  ++stackDepth_g;

  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_ = "";
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue:
    {
    Value v(true);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenFalse:
    {
    Value v(false);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenNull:
    {
    Value v;
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    }
    break;
  case tokenArraySeparator:
  case tokenObjectEnd:
  case tokenArrayEnd:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      Value v;
      currentValue().swapPayload(v);
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    } // Else, fall through...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValue_ = &currentValue();
  }

  --stackDepth_g;
  return successful;
}